

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void duckdb_je_sdallocx(void *ptr,size_t size,int flags)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  cache_bin_t *bin_00;
  int in_EDX;
  ulong in_RSI;
  void *in_RDI;
  long *in_FS_OFFSET;
  cache_bin_t *bin;
  tcache_t *tcache;
  _Bool fail;
  uint64_t deallocated_after;
  size_t usize;
  uint64_t threshold;
  uint64_t deallocated;
  _Bool err;
  emap_alloc_ctx_t alloc_ctx;
  tsd_t *tsd;
  tcache_t *tcache_1;
  size_t ret_1;
  szind_t ret;
  uint8_t state;
  uint8_t state_3;
  tcaches_t *elm;
  uint8_t state_2;
  _Bool err_1;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx;
  uint8_t state_4;
  uint8_t state_1;
  int in_stack_fffffffffffffdd4;
  size_t in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  
  if (in_EDX == 0) {
    in_stack_fffffffffffffdd4 = CONCAT13(1,(int3)in_stack_fffffffffffffdd4);
    lVar1 = *in_FS_OFFSET;
    if (lVar1 == 0x2a90) {
      bVar2 = false;
    }
    else if (in_RSI < 0x1001) {
      uVar3 = *(long *)(lVar1 + -0x2740) +
              duckdb_je_sz_index2size_tab[(uint)duckdb_je_sz_size2index_tab[in_RSI + 7 >> 3]];
      if (uVar3 < *(ulong *)(lVar1 + -0x2738)) {
        bin_00 = (cache_bin_t *)
                 (lVar1 + -0x2728 + (ulong)(uint)duckdb_je_sz_size2index_tab[in_RSI + 7 >> 3] * 0x18
                 );
        if (((uint)bin_00->stack_head & 0xffff) == (uint)bin_00->low_bits_full) {
          bVar2 = false;
        }
        else {
          bin_00->stack_head = bin_00->stack_head + -1;
          *bin_00->stack_head = in_RDI;
          cache_bin_assert_earlier(bin_00,bin_00->low_bits_full,(uint16_t)bin_00->stack_head);
          *(ulong *)(lVar1 + -0x2740) = uVar3;
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
    in_stack_fffffffffffffdd8 = in_RSI;
    in_stack_fffffffffffffde0 = in_RDI;
    if (bVar2) {
      return;
    }
  }
  duckdb_je_sdallocx_default
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_sdallocx(void *ptr, size_t size, int flags) {
	LOG("core.sdallocx.entry", "ptr: %p, size: %zu, flags: %d", ptr,
		size, flags);

	je_sdallocx_impl(ptr, size, flags);

	LOG("core.sdallocx.exit", "");
}